

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

string * __thiscall Shell::GetCommand_abi_cxx11_(string *__return_storage_ptr__,Shell *this)

{
  char cVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__,cVar1);
  return __return_storage_ptr__;
}

Assistant:

string Shell::GetCommand(){
	string s;
	getline(cin, s);
	return s;
}